

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall ApprovalTests::TestName::findFileName(TestName *this,string *file)

{
  string *in_RDI;
  string newFileName;
  string *fullPath;
  string local_38 [56];
  
  fullPath = in_RDI;
  checkParentDirectoriesForFile((string *)this);
  SystemUtils::checkFilenameCase(fullPath);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string TestName::findFileName(const std::string& file)
    {
        auto newFileName = checkParentDirectoriesForFile(file);
        return SystemUtils::checkFilenameCase(newFileName);
    }